

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_skein.c
# Opt level: O0

void xmr_skein(SkeinBitSequence *data,SkeinBitSequence *hashval)

{
  Skein_512_Ctxt_t *ctx;
  hashState_conflict state;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff4c;
  Skein_512_Ctxt_t *ctx_00;
  undefined1 auStack_90 [24];
  u08b_t *in_stack_ffffffffffffff88;
  Skein_512_Ctxt_t *in_stack_ffffffffffffff90;
  
  uVar1 = 0x200;
  ctx_00 = (Skein_512_Ctxt_t *)0x100;
  memcpy(auStack_90,SKEIN_512_IV_256,0x40);
  Skein_512_Update(ctx_00,(u08b_t *)CONCAT44(in_stack_ffffffffffffff4c,uVar1),
                   (size_t)&stack0xffffffffffffff50);
  Skein_512_Final(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return;
}

Assistant:

void xmr_skein(const SkeinBitSequence *data, SkeinBitSequence *hashval){
  #define XMR_HASHBITLEN 256
  #define XMR_DATABITLEN 1600

  // Init
  hashState  state;
  state.statebits = 64*SKEIN_512_STATE_WORDS;

  // Skein_512_Init(&state.u.ctx_512, (size_t)XMR_HASHBITLEN);
  state.u.ctx_512.h.hashBitLen = XMR_HASHBITLEN;
  memcpy(state.u.ctx_512.X,SKEIN_512_IV_256,sizeof(state.u.ctx_512.X));
  Skein_512_Ctxt_t* ctx = &(state.u.ctx_512);
  Skein_Start_New_Type(ctx,MSG);

  // Update
  if ((XMR_DATABITLEN & 7) == 0){  /* partial bytes? */
    Skein_512_Update(&state.u.ctx_512,data,XMR_DATABITLEN >> 3);
  }else{   /* handle partial final byte */
    size_t bCnt = (XMR_DATABITLEN >> 3) + 1;                  /* number of bytes to handle (nonzero here!) */
    u08b_t b,mask;

    mask = (u08b_t) (1u << (7 - (XMR_DATABITLEN & 7)));       /* partial byte bit mask */
    b    = (u08b_t) ((data[bCnt-1] & (0-mask)) | mask);   /* apply bit padding on final byte */

    Skein_512_Update(&state.u.ctx_512,data,bCnt-1); /* process all but the final byte    */
    Skein_512_Update(&state.u.ctx_512,&b  ,  1   ); /* process the (masked) partial byte */
    Skein_Set_Bit_Pad_Flag(state.u.h);                    /* set tweak flag for the final call */
  }

  // Finalize
  Skein_512_Final(&state.u.ctx_512, hashval);
}